

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxRectsBinPack.cpp
# Opt level: O0

Rect * __thiscall
rbp::MaxRectsBinPack::FindPositionForNewNodeContactPoint
          (Rect *__return_storage_ptr__,MaxRectsBinPack *this,int width,int height,
          int *bestContactScore)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong uStack_28;
  int score;
  size_t i;
  int *bestContactScore_local;
  int height_local;
  int width_local;
  MaxRectsBinPack *this_local;
  
  memset(__return_storage_ptr__,0,0x14);
  *bestContactScore = -1;
  for (uStack_28 = 0;
      sVar2 = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::size(&this->freeRectangles),
      uStack_28 < sVar2; uStack_28 = uStack_28 + 1) {
    pvVar3 = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::operator[]
                       (&this->freeRectangles,uStack_28);
    if ((width <= pvVar3->width) &&
       (pvVar3 = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::operator[]
                           (&this->freeRectangles,uStack_28), height <= pvVar3->height)) {
      pvVar3 = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::operator[]
                         (&this->freeRectangles,uStack_28);
      iVar1 = pvVar3->x;
      pvVar3 = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::operator[]
                         (&this->freeRectangles,uStack_28);
      iVar1 = ContactPointScoreNode(this,iVar1,pvVar3->y,width,height);
      if (*bestContactScore < iVar1) {
        pvVar3 = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::operator[]
                           (&this->freeRectangles,uStack_28);
        __return_storage_ptr__->x = pvVar3->x;
        pvVar3 = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::operator[]
                           (&this->freeRectangles,uStack_28);
        __return_storage_ptr__->y = pvVar3->y;
        __return_storage_ptr__->width = width;
        __return_storage_ptr__->height = height;
        *bestContactScore = iVar1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Rect MaxRectsBinPack::FindPositionForNewNodeContactPoint(int width, int height, int& bestContactScore) const
	{
		Rect bestNode;
		memset(&bestNode, 0, sizeof(Rect));

		bestContactScore = -1;

		for (size_t i = 0; i < freeRectangles.size(); ++i)
		{
			// Try to place the rectangle in upright (non-flipped) orientation.
			if (freeRectangles[i].width >= width && freeRectangles[i].height >= height)
			{
				int score = ContactPointScoreNode(freeRectangles[i].x, freeRectangles[i].y, width, height);
				if (score > bestContactScore)
				{
					bestNode.x = freeRectangles[i].x;
					bestNode.y = freeRectangles[i].y;
					bestNode.width = width;
					bestNode.height = height;
					bestContactScore = score;
				}
			}
#ifdef CAN_FLIP
		if (freeRectangles[i].width >= height && freeRectangles[i].height >= width)
		{
			int score = ContactPointScoreNode(freeRectangles[i].x, freeRectangles[i].y, height, width);
			if (score > bestContactScore)
			{
				bestNode.x = freeRectangles[i].x;
				bestNode.y = freeRectangles[i].y;
				bestNode.width = height;
				bestNode.height = width;
				bestContactScore = score;
			}
		}
#endif
		}
		return bestNode;
	}